

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::read_number_raw
               (u8 **ptr,u8 **pre,yyjson_read_flag flg,yyjson_val *val,char **msg)

{
  byte *pbVar1;
  u8 *puVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  u8 *puVar6;
  u8 *puVar7;
  uint64_t uVar8;
  bool bVar9;
  
  puVar2 = *ptr;
  if (*pre != (u8 *)0x0) {
    **pre = '\0';
  }
  bVar9 = *puVar2 == '-';
  puVar7 = puVar2 + bVar9;
  bVar5 = puVar2[bVar9];
  if ((digi_table[bVar5] & 3) == 0) {
    if ((flg & 0x10) != 0) {
      if (bVar5 < 0x69) {
        if (bVar5 == 0x49) {
LAB_018ac330:
          if (((puVar7[1] | 0x20) == 0x6e) && ((puVar7[2] | 0x20) == 0x66)) {
            puVar6 = puVar7 + 3;
            if ((((puVar7[3] | 0x20) == 0x69) &&
                ((((puVar7[4] | 0x20) == 0x6e && ((puVar7[5] | 0x20) == 0x69)) &&
                 ((puVar7[6] | 0x20) == 0x74)))) && ((puVar7[7] | 0x20) == 0x79)) {
              puVar6 = puVar7 + 8;
            }
            puVar7 = *pre;
            goto LAB_018ac3dd;
          }
          if ((bVar5 | 0x20) == 0x6e) goto LAB_018ac3b1;
        }
        else if (bVar5 == 0x4e) goto LAB_018ac3b1;
      }
      else if (bVar5 == 0x6e) {
LAB_018ac3b1:
        if (((puVar7[1] | 0x20) == 0x61) && ((puVar7[2] | 0x20) == 0x6e)) {
          puVar6 = puVar7 + 3;
          puVar7 = *pre;
LAB_018ac3dd:
          if (puVar7 != (u8 *)0x0) {
            *puVar7 = '\0';
          }
          val->tag = ((long)puVar6 - (long)puVar2) * 0x100 + 1;
          (val->uni).str = (char *)puVar2;
          *pre = puVar6;
          bVar9 = true;
          goto LAB_018ac2f1;
        }
      }
      else if (bVar5 == 0x69) goto LAB_018ac330;
    }
    pcVar3 = "no digit after minus sign";
LAB_018ac2ec:
    *msg = pcVar3;
    bVar9 = false;
    puVar6 = puVar7;
    goto LAB_018ac2f1;
  }
  if (bVar5 == 0x30) {
    bVar5 = puVar7[1];
    bVar4 = digi_table[bVar5];
    if ((bVar4 & 3) != 0) {
      pcVar3 = "number with leading zero is not allowed";
      goto LAB_018ac2ec;
    }
    puVar6 = puVar7 + 1;
    if ((bVar4 & 0x30) != 0) goto LAB_018ac258;
LAB_018ac2b4:
    val->tag = ((long)puVar6 - (long)puVar2) * 0x100 + 1;
  }
  else {
    puVar6 = puVar2 + ((ulong)bVar9 - 1);
    uVar8 = (ulong)bVar9 * 0x100 - 0xff;
    do {
      bVar5 = puVar6[1];
      puVar6 = puVar6 + 1;
      bVar4 = digi_table[bVar5];
      uVar8 = uVar8 + 0x100;
    } while ((bVar4 & 3) != 0);
    if ((bVar4 & 0x30) != 0) {
LAB_018ac258:
      if (bVar5 == 0x2e) {
        if ((digi_table[puVar6[1]] & 3) == 0) {
          puVar7 = puVar6 + 2;
          pcVar3 = "no digit after decimal point";
          goto LAB_018ac2ec;
        }
        puVar6 = puVar6 + 1;
        do {
          pbVar1 = puVar6 + 1;
          puVar6 = puVar6 + 1;
          bVar4 = digi_table[*pbVar1];
        } while ((bVar4 & 3) != 0);
      }
      if ((bVar4 & 0x20) != 0) {
        bVar9 = (digi_table[puVar6[1]] & 0xc) == 0;
        if ((digi_table[puVar6[2 - (ulong)bVar9]] & 3) == 0) {
          puVar7 = puVar6 + (3 - (ulong)bVar9);
          pcVar3 = "no digit after exponent sign";
          goto LAB_018ac2ec;
        }
        puVar6 = puVar6 + (2 - (ulong)bVar9);
        do {
          pbVar1 = puVar6 + 1;
          puVar6 = puVar6 + 1;
        } while ((digi_table[*pbVar1] & 3) != 0);
      }
      goto LAB_018ac2b4;
    }
    val->tag = uVar8;
  }
  (val->uni).str = (char *)puVar2;
  *pre = puVar6;
  bVar9 = true;
LAB_018ac2f1:
  *ptr = puVar6;
  return bVar9;
}

Assistant:

static_noinline bool read_number_raw(u8 **ptr,
                                     u8 **pre,
                                     yyjson_read_flag flg,
                                     yyjson_val *val,
                                     const char **msg) {

#define return_err(_pos, _msg) do { \
    *msg = _msg; \
    *end = _pos; \
    return false; \
} while (false)

#define return_raw() do { \
    val->tag = ((u64)(cur - hdr) << YYJSON_TAG_BIT) | YYJSON_TYPE_RAW; \
    val->uni.str = (const char *)hdr; \
    *pre = cur; *end = cur; return true; \
} while (false)

    u8 *hdr = *ptr;
    u8 *cur = *ptr;
    u8 **end = ptr;

    /* add null-terminator for previous raw string */
    if (*pre) **pre = '\0';

    /* skip sign */
    cur += (*cur == '-');

    /* read first digit, check leading zero */
    if (unlikely(!digi_is_digit(*cur))) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (read_inf_or_nan(*hdr == '-', &cur, pre, val)) return_raw();
        }
        return_err(cur, "no digit after minus sign");
    }

    /* read integral part */
    if (*cur == '0') {
        cur++;
        if (unlikely(digi_is_digit(*cur))) {
            return_err(cur - 1, "number with leading zero is not allowed");
        }
        if (!digi_is_fp(*cur)) return_raw();
    } else {
        while (digi_is_digit(*cur)) cur++;
        if (!digi_is_fp(*cur)) return_raw();
    }

    /* read fraction part */
    if (*cur == '.') {
        cur++;
        if (!digi_is_digit(*cur++)) {
            return_err(cur, "no digit after decimal point");
        }
        while (digi_is_digit(*cur)) cur++;
    }

    /* read exponent part */
    if (digi_is_exp(*cur)) {
        cur += 1 + digi_is_sign(cur[1]);
        if (!digi_is_digit(*cur++)) {
            return_err(cur, "no digit after exponent sign");
        }
        while (digi_is_digit(*cur)) cur++;
    }

    return_raw();

#undef return_err
#undef return_raw
}